

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpatch_tests.cpp
# Opt level: O1

void check_patch<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *target,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *patch,
               error_code *expected_ec,
               basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *expected)

{
  int iVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  bool bVar3;
  bool bVar4;
  error_code ec;
  AssertionHandler catchAssertionHandler;
  error_code local_e8;
  SourceLineInfo local_d8;
  AssertionHandler local_c8;
  ITransientExpression local_80;
  error_code *local_70;
  char *local_68;
  size_t sStack_60;
  error_code *local_58;
  StringRef local_50;
  StringRef local_40;
  
  local_e8._M_value = 0;
  local_e8._M_cat = (error_category *)std::_V2::system_category();
  jsoncons::jsonpatch::
  apply_patch<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            (target,patch,&local_e8);
  if ((local_e8._M_cat == expected_ec->_M_cat) && (local_e8._M_value == expected_ec->_M_value)) {
    iVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                      (expected,target);
    if (iVar1 == 0) goto LAB_003af47a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"target:\n",8);
  pbVar2 = jsoncons::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,target);
  local_c8.m_assertionInfo.macroName.m_start._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(pbVar2,(char *)&local_c8,1);
LAB_003af47a:
  local_80._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_80.m_isBinaryExpression = true;
  local_80.m_result = false;
  local_80._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpatch/src/jsonpatch_tests.cpp"
  ;
  local_d8.line = 0x1d;
  Catch::StringRef::StringRef(&local_40,"ec == expected_ec");
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,(StringRef *)&local_80,&local_d8,local_40,ContinueOnFailure);
  bVar3 = local_e8._M_cat == expected_ec->_M_cat;
  bVar4 = local_e8._M_value == expected_ec->_M_value;
  Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
  local_80.m_result = bVar4 && bVar3;
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b61530;
  local_68 = local_d8.file;
  sStack_60 = local_d8.line;
  local_70 = &local_e8;
  local_58 = expected_ec;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_80._vptr_ITransientExpression = (_func_int **)0x8102c5;
  local_80.m_isBinaryExpression = true;
  local_80.m_result = false;
  local_80._10_6_ = 0;
  local_d8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonpatch/src/jsonpatch_tests.cpp"
  ;
  local_d8.line = 0x1e;
  Catch::StringRef::StringRef(&local_50,"expected == target");
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,(StringRef *)&local_80,&local_d8,local_50,ContinueOnFailure);
  iVar1 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::compare
                    (expected,target);
  Catch::StringRef::StringRef((StringRef *)&local_d8,"==");
  local_80.m_result = iVar1 == 0;
  local_80.m_isBinaryExpression = true;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00b59c50;
  local_68 = local_d8.file;
  sStack_60 = local_d8.line;
  local_70 = (error_code *)expected;
  local_58 = (error_code *)target;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  return;
}

Assistant:

void check_patch(Json& target, const Json& patch, const std::error_code& expected_ec, const Json& expected)
{
    std::error_code ec;
    jsonpatch::apply_patch(target, patch, ec);
    if (ec != expected_ec || expected != target)
    {
        std::cout << "target:\n" << target << '\n';
    }
    CHECK(ec == expected_ec); //-V521
    CHECK(expected == target); //-V521
}